

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void QGraphicsScenePrivate::updateTouchPointsForItem(QGraphicsItem *item,QTouchEvent *touchEvent)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  qreal *pqVar4;
  QPointF *pQVar5;
  int i;
  ulong uVar6;
  long in_FS_OFFSET;
  undefined8 uVar7;
  undefined8 in_XMM1_Qa;
  QTransform mapFromScene;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pqVar4 = (qreal *)&DAT_006795c0;
  pQVar5 = (QPointF *)&mapFromScene;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    pQVar5->xp = *pqVar4;
    pqVar4 = pqVar4 + 1;
    pQVar5 = (QPointF *)&pQVar5->yp;
  }
  QGraphicsItemPrivate::genericMapFromSceneTransform
            (&mapFromScene,(item->d_ptr).d,*(QWidget **)(touchEvent + 0x40));
  for (uVar6 = 0; uVar6 < *(ulong *)(touchEvent + 0x38); uVar6 = uVar6 + 1) {
    plVar2 = (long *)QPointerEvent::point((longlong)touchEvent);
    QEventPoint::scenePosition();
    uVar7 = QTransform::map((QPointF *)&mapFromScene);
    lVar3 = *plVar2;
    *(undefined8 *)(lVar3 + 0x30) = uVar7;
    *(undefined8 *)(lVar3 + 0x38) = in_XMM1_Qa;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::updateTouchPointsForItem(QGraphicsItem *item, QTouchEvent *touchEvent)
{
    const QTransform mapFromScene =
        item->d_ptr->genericMapFromSceneTransform(static_cast<const QWidget *>(touchEvent->target()));

    for (int i = 0; i < touchEvent->pointCount(); ++i) {
        auto &pt = touchEvent->point(i);
        QMutableEventPoint::setPosition(pt, mapFromScene.map(pt.scenePosition()));
    }
}